

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O0

void __thiscall density::lifo_buffer::~lifo_buffer(lifo_buffer *this)

{
  void *i_block;
  unsigned_long i_size;
  lifo_buffer *this_local;
  
  i_block = this->m_data;
  i_size = uint_upper_align<unsigned_long>(this->m_size,8);
  detail::ThreadLifoAllocator<0>::deallocate(i_block,i_size);
  return;
}

Assistant:

~lifo_buffer()
        {
            detail::ThreadLifoAllocator<>::deallocate(m_data, uint_upper_align(m_size, alignment));
        }